

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insert
          (iterator *this,int left,int right,int *value,allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<int,_int,_0U> *this_01;
  void *pvVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uintptr_t intWord;
  ulong uVar5;
  IndexPair offset;
  uint uVar6;
  uint32_t position;
  pointer pEVar7;
  long lVar8;
  size_type sVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  
  this_01 = (this->super_const_iterator).map;
  this_00 = &(this->super_const_iterator).path;
  if (this_01->height == 0) {
    uVar10 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
             [(this->super_const_iterator).path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
    uVar5 = (ulong)uVar10;
    position = 0x10;
    if (uVar5 != 0x10) {
      uVar3 = this_01->rootSize;
      if (uVar10 != uVar3) {
        position = uVar10;
        uVar6 = uVar3;
        if (uVar3 == 0x10) goto LAB_004f4902;
        do {
          uVar4 = uVar6 - 1;
          *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar6 * 8) =
               *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar4 * 8);
          *(undefined4 *)((long)&this_01->field_0 + (ulong)uVar6 * 4 + 0x80) =
               *(undefined4 *)((long)&this_01->field_0 + (ulong)uVar4 * 4 + 0x80);
          uVar6 = uVar4;
        } while (uVar10 != uVar4);
      }
      *(ulong *)((long)&this_01->field_0 + uVar5 * 8) = CONCAT44(right,left);
      *(int *)((long)&this_01->field_0 + uVar5 * 4 + 0x80) = *value;
      uVar3 = uVar3 + 1;
      pEVar7 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      if (uVar3 < 0x11) {
        this_01->rootSize = uVar3;
        pEVar7->size = uVar3;
        return;
      }
      position = pEVar7[(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                 offset;
    }
LAB_004f4902:
    offset = IntervalMap<int,int,0u>::
             modifyRoot<slang::IntervalMapDetails::LeafNode<int,int,16u,true>,slang::IntervalMapDetails::LeafNode<int,int,16u,false>,true>
                       ((IntervalMap<int,int,0u> *)this_01,(LeafNode<int,_int,_16U,_true> *)this_01,
                        position,alloc);
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (this_00,(BranchNode<int,_12U,_true> *)this_01,this_01->rootSize,offset);
  }
  sVar9 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar9 == 0) ||
     (pEVar7 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar7->size <= pEVar7->offset)) {
    IntervalMapDetails::Path::legalizeForInsert(this_00,((this->super_const_iterator).map)->height);
    pEVar7 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar9 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
  uVar10 = pEVar7[sVar9 - 1].offset;
  uVar5 = (ulong)uVar10;
  if (uVar5 != 0x10) {
    uVar3 = pEVar7[sVar9 - 1].size;
    pvVar1 = pEVar7[sVar9 - 1].node;
    if (uVar10 != uVar3) {
      uVar6 = uVar3;
      if (uVar3 == 0x10) goto LAB_004f49c9;
      do {
        uVar4 = uVar6 - 1;
        *(undefined8 *)((long)pvVar1 + (ulong)uVar6 * 8) =
             *(undefined8 *)((long)pvVar1 + (ulong)uVar4 * 8);
        *(undefined4 *)((long)pvVar1 + (ulong)uVar6 * 4 + 0x80) =
             *(undefined4 *)((long)pvVar1 + (ulong)uVar4 * 4 + 0x80);
        uVar6 = uVar4;
      } while (uVar10 != uVar4);
    }
    *(ulong *)((long)pvVar1 + uVar5 * 8) = CONCAT44(right,left);
    *(int *)((long)pvVar1 + uVar5 * 4 + 0x80) = *value;
    uVar3 = uVar3 + 1;
    sVar9 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    if (uVar3 < 0x11) goto LAB_004f4a54;
  }
LAB_004f49c9:
  IntervalMap<int,int,0u>::iterator::
  overflow<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
            ((iterator *)this,(int)sVar9 - 1,alloc);
  pEVar7 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar9 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar10 = pEVar7[sVar9 - 1].offset;
  uVar5 = (ulong)uVar10;
  uVar3 = 0x11;
  if (uVar5 != 0x10) {
    pvVar1 = pEVar7[sVar9 - 1].node;
    uVar6 = pEVar7[sVar9 - 1].size;
    if (uVar10 != uVar6) {
      uVar4 = uVar6;
      if (uVar6 == 0x10) goto LAB_004f4a54;
      do {
        uVar3 = uVar4 - 1;
        *(undefined8 *)((long)pvVar1 + (ulong)uVar4 * 8) =
             *(undefined8 *)((long)pvVar1 + (ulong)uVar3 * 8);
        *(undefined4 *)((long)pvVar1 + (ulong)uVar4 * 4 + 0x80) =
             *(undefined4 *)((long)pvVar1 + (ulong)uVar3 * 4 + 0x80);
        uVar4 = uVar3;
      } while (uVar10 != uVar3);
    }
    *(ulong *)((long)pvVar1 + uVar5 * 8) = CONCAT44(right,left);
    *(int *)((long)pvVar1 + uVar5 * 4 + 0x80) = *value;
    uVar3 = uVar6 + 1;
    sVar9 = (this->super_const_iterator).path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  }
LAB_004f4a54:
  uVar10 = (int)sVar9 - 1;
  pEVar7 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  lVar8 = (ulong)uVar10 * 0x10;
  pEVar7[uVar10].size = uVar3;
  if (uVar10 != 0) {
    uVar10 = (int)sVar9 - 2;
    *(ulong *)((long)pEVar7[uVar10].node + (ulong)pEVar7[uVar10].offset * 8) =
         *(ulong *)((long)pEVar7[uVar10].node + (ulong)pEVar7[uVar10].offset * 8) &
         0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    do {
      uVar5 = (ulong)*(uint *)((long)pEVar7 + lVar8 + -4);
      lVar2 = *(long *)((long)&pEVar7[-1].node + lVar8);
      iVar11 = *(int *)(lVar2 + 0x60 + uVar5 * 8);
      iVar12 = *(int *)(lVar2 + 100 + uVar5 * 8);
      if (left < iVar11) {
        iVar11 = left;
      }
      *(int *)(lVar2 + 0x60 + uVar5 * 8) = iVar11;
      if (iVar12 <= right) {
        iVar12 = right;
      }
      *(int *)(lVar2 + 100 + uVar5 * 8) = iVar12;
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}